

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

int __thiscall OpenMD::HBondJump::registerHydrogen(HBondJump *this,int frame,int hIndex)

{
  pointer pvVar1;
  int iVar2;
  long lVar3;
  int *__x;
  int local_34 [3];
  
  lVar3 = *(long *)&(this->GIDtoH_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
  iVar2 = *(int *)(lVar3 + (long)hIndex * 4);
  if (iVar2 == -1) {
    pvVar1 = (this->hydrogen_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = (int)((ulong)((long)*(pointer *)
                                 ((long)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         *(long *)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data) >> 2);
    *(int *)(lVar3 + (long)hIndex * 4) = iVar2;
    local_34[0] = hIndex;
    local_34[2] = frame;
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1 + frame,local_34);
    local_34[1] = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((this->acceptor_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame,local_34 + 1);
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((this->selected_).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame,false);
    if (frame == 0) {
      local_34[1] = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((this->lastAcceptor_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,local_34 + 1);
      pvVar1 = (this->acceptorStartFrame_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = local_34 + 2;
    }
    else {
      pvVar1 = (this->lastAcceptor_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)*(int *)(*(long *)&(this->GIDtoH_).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[frame + -1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + (long)local_34[0] * 4) * 4;
      std::vector<int,_std::allocator<int>_>::push_back
                (pvVar1 + frame,
                 (value_type_conflict2 *)
                 (*(long *)&pvVar1[frame + -1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data + lVar3));
      pvVar1 = (this->acceptorStartFrame_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __x = (int *)(lVar3 + *(long *)&pvVar1[(long)frame + -1].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data);
    }
    std::vector<int,_std::allocator<int>_>::push_back(pvVar1 + frame,__x);
  }
  return iVar2;
}

Assistant:

int HBondJump::registerHydrogen(int frame, int hIndex) {
    int index;

    // If this hydrogen wasn't already registered, register it:
    if (GIDtoH_[frame][hIndex] == -1) {
      index                  = hydrogen_[frame].size();
      GIDtoH_[frame][hIndex] = index;
      hydrogen_[frame].push_back(hIndex);
      acceptor_[frame].push_back(-1);
      selected_[frame].push_back(false);

      if (frame == 0) {
        lastAcceptor_[frame].push_back(-1);
        acceptorStartFrame_[frame].push_back(frame);
      } else {
        // Copy the last acceptor.
        int prevIndex = GIDtoH_[frame - 1][hIndex];
        lastAcceptor_[frame].push_back(lastAcceptor_[frame - 1][prevIndex]);
        acceptorStartFrame_[frame].push_back(
            acceptorStartFrame_[frame - 1][prevIndex]);
      }
    } else {
      // This hydrogen was already registered.  Just return the index:
      index = GIDtoH_[frame][hIndex];
    }
    return index;
  }